

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileExecutableTargetGenerator::WriteExecutableRule
          (cmMakefileExecutableTargetGenerator *this,bool relink)

{
  unsigned_long *puVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  cmGeneratorTarget *pcVar4;
  cmMakefile *pcVar5;
  long *plVar6;
  pointer pbVar7;
  bool bVar8;
  bool bVar9;
  bool useResponseFile;
  bool useWatcomQuote;
  int iVar10;
  char *pcVar11;
  string *psVar12;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar13;
  size_t sVar14;
  pointer pbVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  pointer pbVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string linkLanguage;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  EchoProgress progress;
  ios_base local_790 [264];
  string outpath;
  int minor;
  int major;
  string linkFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  real_link_commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exeCleanFiles;
  string linkRuleVar;
  string targetFullPathReal;
  string outpathImp;
  string targetNameImport;
  string targetName;
  string flags;
  string targetOutPath;
  string targetFullPath;
  string targetNameReal;
  string linkFlagsConfig;
  string buildObjs;
  string linkLibs;
  string targetOutPathReal;
  string targetNamePDB;
  string objectDir;
  string targetFullPathImport;
  string pdbOutputPath;
  long *local_3d0 [2];
  long local_3c0 [2];
  string targetVersionMinor;
  string targetVersionMajor;
  string targetFullPathPDB;
  string target;
  string manifests;
  string linkRule;
  string targetOutPathImport;
  string targetOutPathPDB;
  string compilePdbOutputPath;
  string buildEcho;
  ios_base local_220 [264];
  RuleVariables vars;
  
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmMakefileTargetGenerator::AppendLinkDepends(&this->super_cmMakefileTargetGenerator,&depends);
  targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
  targetName._M_string_length = 0;
  targetName.field_2._M_local_buf[0] = '\0';
  targetNameReal._M_dataplus._M_p = (pointer)&targetNameReal.field_2;
  targetNameReal._M_string_length = 0;
  targetNameReal.field_2._M_local_buf[0] = '\0';
  targetNameImport._M_dataplus._M_p = (pointer)&targetNameImport.field_2;
  targetNameImport._M_string_length = 0;
  targetNameImport.field_2._M_local_buf[0] = '\0';
  targetNamePDB._M_dataplus._M_p = (pointer)&targetNamePDB.field_2;
  targetNamePDB._M_string_length = 0;
  targetNamePDB.field_2._M_local_buf[0] = '\0';
  psVar12 = &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName;
  cmGeneratorTarget::GetExecutableNames
            ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &targetName,&targetNameReal,&targetNameImport,&targetNamePDB,psVar12);
  cmGeneratorTarget::GetDirectory
            (&outpath,(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget,psVar12,false);
  bVar8 = cmGeneratorTarget::IsAppBundleOnApple
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if (bVar8) {
    cmOSXBundleGenerator::CreateAppBundle
              ((this->super_cmMakefileTargetGenerator).OSXBundleGenerator,&targetName,&outpath);
  }
  std::__cxx11::string::append((char *)&outpath);
  outpathImp._M_dataplus._M_p = (pointer)&outpathImp.field_2;
  outpathImp._M_string_length = 0;
  outpathImp.field_2._M_local_buf[0] = '\0';
  if (relink) {
    pcVar11 = cmMakefile::GetCurrentBinaryDirectory
                        ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                         Makefile);
    strlen(pcVar11);
    std::__cxx11::string::_M_replace
              ((ulong)&outpath,0,(char *)outpath._M_string_length,(ulong)pcVar11);
    std::__cxx11::string::append((char *)&outpath);
    std::__cxx11::string::append((char *)&outpath);
    cmsys::SystemTools::MakeDirectory(outpath._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&outpath);
    if (targetNameImport._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&outpathImp);
    }
  }
  else {
    cmsys::SystemTools::MakeDirectory(outpath._M_dataplus._M_p);
    if (targetNameImport._M_string_length != 0) {
      cmGeneratorTarget::GetDirectory
                (&progress.Dir,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget,psVar12,true);
      std::__cxx11::string::operator=((string *)&outpathImp,(string *)&progress);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
        operator_delete(progress.Dir._M_dataplus._M_p,
                        CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                                 progress.Dir.field_2._M_local_buf[0]) + 1);
      }
      cmsys::SystemTools::MakeDirectory(outpathImp._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&outpathImp);
    }
  }
  cmGeneratorTarget::GetCompilePDBDirectory
            (&compilePdbOutputPath,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             psVar12);
  cmsys::SystemTools::MakeDirectory(compilePdbOutputPath._M_dataplus._M_p);
  cmGeneratorTarget::GetPDBDirectory
            (&pdbOutputPath,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             psVar12);
  cmsys::SystemTools::MakeDirectory(pdbOutputPath._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&pdbOutputPath);
  std::operator+(&targetFullPath,&outpath,&targetName);
  std::operator+(&targetFullPathReal,&outpath,&targetNameReal);
  std::operator+(&targetFullPathPDB,&pdbOutputPath,&targetNamePDB);
  std::operator+(&targetFullPathImport,&outpathImp,&targetNameImport);
  cmCommonTargetGenerator::Convert
            (&targetOutPathPDB,(cmCommonTargetGenerator *)this,&targetFullPathPDB,NONE,SHELL);
  cmCommonTargetGenerator::Convert
            (&targetOutPath,(cmCommonTargetGenerator *)this,&targetFullPath,START_OUTPUT,SHELL);
  cmCommonTargetGenerator::Convert
            (&targetOutPathReal,(cmCommonTargetGenerator *)this,&targetFullPathReal,START_OUTPUT,
             SHELL);
  cmCommonTargetGenerator::Convert
            (&targetOutPathImport,(cmCommonTargetGenerator *)this,&targetFullPathImport,START_OUTPUT
             ,SHELL);
  cmGeneratorTarget::GetLinkerLanguage
            (&linkLanguage,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             psVar12);
  if (linkLanguage._M_string_length == 0) {
    psVar12 = cmGeneratorTarget::GetName_abi_cxx11_
                        ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget);
    cmSystemTools::Error
              ("Cannot determine link language for target \"",(psVar12->_M_dataplus)._M_p,"\".",
               (char *)0x0);
  }
  else {
    puVar1 = &(this->super_cmMakefileTargetGenerator).NumberOfProgressActions;
    *puVar1 = *puVar1 + 1;
    if ((this->super_cmMakefileTargetGenerator).NoRuleMessages == false) {
      paVar16 = &progress.Dir.field_2;
      progress.Dir._M_string_length = 0;
      progress.Dir.field_2._M_local_buf[0] = '\0';
      paVar2 = &progress.Arg.field_2;
      progress.Arg._M_string_length = 0;
      progress.Arg.field_2._M_local_buf[0] = '\0';
      progress.Dir._M_dataplus._M_p = (pointer)paVar16;
      progress.Arg._M_dataplus._M_p = (pointer)paVar2;
      cmMakefileTargetGenerator::MakeEchoProgress(&this->super_cmMakefileTargetGenerator,&progress);
      buildEcho._M_dataplus._M_p = (pointer)&buildEcho.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&buildEcho,"Linking ","");
      std::__cxx11::string::_M_append((char *)&buildEcho,(ulong)linkLanguage._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&buildEcho);
      std::__cxx11::string::_M_append((char *)&buildEcho,(ulong)targetOutPath._M_dataplus._M_p);
      pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      std::__cxx11::string::string((string *)&vars,buildEcho._M_dataplus._M_p,(allocator *)&flags);
      cmLocalUnixMakefileGenerator3::AppendEcho(pcVar3,&commands,(string *)&vars,EchoLink,&progress)
      ;
      if (vars.CMTarget != (cmGeneratorTarget *)&vars.TargetCompilePDB) {
        operator_delete(vars.CMTarget,(ulong)(vars.TargetCompilePDB + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)buildEcho._M_dataplus._M_p != &buildEcho.field_2) {
        operator_delete(buildEcho._M_dataplus._M_p,buildEcho.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)progress.Arg._M_dataplus._M_p != paVar2) {
        operator_delete(progress.Arg._M_dataplus._M_p,
                        CONCAT71(progress.Arg.field_2._M_allocated_capacity._1_7_,
                                 progress.Arg.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)progress.Dir._M_dataplus._M_p != paVar16) {
        operator_delete(progress.Dir._M_dataplus._M_p,
                        CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                                 progress.Dir.field_2._M_local_buf[0]) + 1);
      }
    }
    flags._M_dataplus._M_p = (pointer)&flags.field_2;
    flags._M_string_length = 0;
    flags.field_2._M_local_buf[0] = '\0';
    linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
    linkFlags._M_string_length = 0;
    linkFlags.field_2._M_local_buf[0] = '\0';
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&progress,"CMAKE_EXE_LINKER_FLAGS","")
    ;
    cmLocalGenerator::AddConfigVariableFlags
              ((cmLocalGenerator *)pcVar3,&linkFlags,&progress.Dir,psVar12);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
      operator_delete(progress.Dir._M_dataplus._M_p,
                      CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                               progress.Dir.field_2._M_local_buf[0]) + 1);
    }
    pcVar4 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&progress,"WIN32_EXECUTABLE","");
    bVar8 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,&progress.Dir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
      operator_delete(progress.Dir._M_dataplus._M_p,
                      CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                               progress.Dir.field_2._M_local_buf[0]) + 1);
    }
    pcVar5 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
    if (bVar8) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&progress,"CMAKE_CREATE_WIN32_EXE","");
      pcVar11 = cmMakefile::GetDefinition(pcVar5,&progress.Dir);
      (*(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
                (pcVar3,&linkFlags,pcVar11);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&progress,"CMAKE_CREATE_CONSOLE_EXE","");
      pcVar11 = cmMakefile::GetDefinition(pcVar5,&progress.Dir);
      (*(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
                (pcVar3,&linkFlags,pcVar11);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
      operator_delete(progress.Dir._M_dataplus._M_p,
                      CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                               progress.Dir.field_2._M_local_buf[0]) + 1);
    }
    bVar8 = cmGeneratorTarget::IsExecutableWithExports
                      ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
    if (bVar8) {
      progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&progress,"CMAKE_EXE_EXPORTS_","");
      std::__cxx11::string::_M_append((char *)&progress,(ulong)linkLanguage._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&progress);
      pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pcVar11 = cmMakefile::GetDefinition
                          ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                           Makefile,&progress.Dir);
      (*(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
                (pcVar3,&linkFlags,pcVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
        operator_delete(progress.Dir._M_dataplus._M_p,
                        CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                                 progress.Dir.field_2._M_local_buf[0]) + 1);
      }
    }
    cmCommonTargetGenerator::AddFeatureFlags((cmCommonTargetGenerator *)this,&flags,&linkLanguage);
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,&flags,
               (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
               ,&linkLanguage,psVar12);
    pcVar4 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&progress,"LINK_FLAGS","");
    pcVar11 = cmGeneratorTarget::GetProperty(pcVar4,&progress.Dir);
    (*(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
              (pcVar3,&linkFlags,pcVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
      operator_delete(progress.Dir._M_dataplus._M_p,
                      CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                               progress.Dir.field_2._M_local_buf[0]) + 1);
    }
    linkFlagsConfig._M_dataplus._M_p = (pointer)&linkFlagsConfig.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&linkFlagsConfig,"LINK_FLAGS_","");
    cmsys::SystemTools::UpperCase(&progress.Dir,psVar12);
    std::__cxx11::string::_M_append((char *)&linkFlagsConfig,(ulong)progress.Dir._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
      operator_delete(progress.Dir._M_dataplus._M_p,
                      CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                               progress.Dir.field_2._M_local_buf[0]) + 1);
    }
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    pcVar11 = cmGeneratorTarget::GetProperty
                        ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget,&linkFlagsConfig);
    (*(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
              (pcVar3,&linkFlags,pcVar11);
    cmCommonTargetGenerator::AddModuleDefinitionFlag((cmCommonTargetGenerator *)this,&linkFlags);
    exeCleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    exeCleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    exeCleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmCommonTargetGenerator::Convert
              (&progress.Dir,(cmCommonTargetGenerator *)this,&targetFullPath,START_OUTPUT,UNCHANGED)
    ;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&exeCleanFiles,
               &progress.Dir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
      operator_delete(progress.Dir._M_dataplus._M_p,
                      CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                               progress.Dir.field_2._M_local_buf[0]) + 1);
    }
    if ((targetNameReal._M_string_length != targetName._M_string_length) ||
       ((targetNameReal._M_string_length != 0 &&
        (iVar10 = bcmp(targetNameReal._M_dataplus._M_p,targetName._M_dataplus._M_p,
                       targetNameReal._M_string_length), iVar10 != 0)))) {
      cmCommonTargetGenerator::Convert
                (&progress.Dir,(cmCommonTargetGenerator *)this,&targetFullPathReal,START_OUTPUT,
                 UNCHANGED);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&exeCleanFiles
                 ,&progress.Dir);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
        operator_delete(progress.Dir._M_dataplus._M_p,
                        CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                                 progress.Dir.field_2._M_local_buf[0]) + 1);
      }
    }
    if (targetNameImport._M_string_length != 0) {
      cmCommonTargetGenerator::Convert
                (&progress.Dir,(cmCommonTargetGenerator *)this,&targetFullPathImport,START_OUTPUT,
                 UNCHANGED);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&exeCleanFiles
                 ,&progress.Dir);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
        operator_delete(progress.Dir._M_dataplus._M_p,
                        CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                                 progress.Dir.field_2._M_local_buf[0]) + 1);
      }
      progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
      progress.Dir._M_string_length = 0;
      progress.Dir.field_2._M_local_buf[0] = '\0';
      bVar8 = cmGeneratorTarget::GetImplibGNUtoMS
                        ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget,&targetFullPathImport,&progress.Dir,(char *)0x0);
      if (bVar8) {
        cmCommonTargetGenerator::Convert
                  (&buildEcho,(cmCommonTargetGenerator *)this,&progress.Dir,START_OUTPUT,UNCHANGED);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &exeCleanFiles,&buildEcho);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)buildEcho._M_dataplus._M_p != &buildEcho.field_2) {
          operator_delete(buildEcho._M_dataplus._M_p,buildEcho.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
        operator_delete(progress.Dir._M_dataplus._M_p,
                        CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                                 progress.Dir.field_2._M_local_buf[0]) + 1);
      }
    }
    cmCommonTargetGenerator::Convert
              (&progress.Dir,(cmCommonTargetGenerator *)this,&targetFullPathPDB,START_OUTPUT,
               UNCHANGED);
    this_00 = &(this->super_cmMakefileTargetGenerator).CleanFiles;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &progress.Dir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
      operator_delete(progress.Dir._M_dataplus._M_p,
                      CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                               progress.Dir.field_2._M_local_buf[0]) + 1);
    }
    if (!relink) {
      pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pvVar13 = cmGeneratorTarget::GetPreBuildCommands
                          ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                           GeneratorTarget);
      cmLocalUnixMakefileGenerator3::AppendCustomCommands
                (pcVar3,&commands,pvVar13,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget,HOME_OUTPUT);
      pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pvVar13 = cmGeneratorTarget::GetPreLinkCommands
                          ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                           GeneratorTarget);
      cmLocalUnixMakefileGenerator3::AppendCustomCommands
                (pcVar3,&commands,pvVar13,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget,HOME_OUTPUT);
    }
    bVar8 = (((this->super_cmMakefileTargetGenerator).GlobalGenerator)->
            super_cmGlobalCommonGenerator).super_cmGlobalGenerator.UseLinkScript;
    real_link_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    real_link_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    real_link_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    linkRuleVar._M_dataplus._M_p = (pointer)&linkRuleVar.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&linkRuleVar,"CMAKE_","");
    std::__cxx11::string::_M_append((char *)&linkRuleVar,(ulong)linkLanguage._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&linkRuleVar);
    cmMakefileTargetGenerator::GetLinkRule
              (&linkRule,&this->super_cmMakefileTargetGenerator,&linkRuleVar);
    commands1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    commands1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    commands1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmSystemTools::ExpandListArgument(&linkRule,&real_link_commands,false);
    bVar9 = cmGeneratorTarget::IsExecutableWithExports
                      ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
    if (bVar9) {
      progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&progress,"CMAKE_","");
      std::__cxx11::string::_M_append((char *)&progress,(ulong)linkLanguage._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&progress);
      pcVar11 = cmMakefile::GetDefinition
                          ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                           Makefile,&progress.Dir);
      if (pcVar11 != (char *)0x0) {
        buildEcho._M_dataplus._M_p = (pointer)&buildEcho.field_2;
        sVar14 = strlen(pcVar11);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&buildEcho,pcVar11,pcVar11 + sVar14);
        cmSystemTools::ExpandListArgument(&buildEcho,&real_link_commands,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)buildEcho._M_dataplus._M_p != &buildEcho.field_2) {
          operator_delete(buildEcho._M_dataplus._M_p,buildEcho.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
        operator_delete(progress.Dir._M_dataplus._M_p,
                        CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                                 progress.Dir.field_2._M_local_buf[0]) + 1);
      }
    }
    progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&progress,"CMAKE_","");
    std::__cxx11::string::_M_append((char *)&progress,(ulong)linkLanguage._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&progress);
    bVar9 = cmMakefile::IsOn((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                             Makefile,&progress.Dir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
      operator_delete(progress.Dir._M_dataplus._M_p,
                      CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                               progress.Dir.field_2._M_local_buf[0]) + 1);
    }
    progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&progress,"CMAKE_","");
    std::__cxx11::string::_M_append((char *)&progress,(ulong)linkLanguage._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&progress);
    useResponseFile =
         cmMakefile::IsOn((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                          Makefile,&progress.Dir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
      operator_delete(progress.Dir._M_dataplus._M_p,
                      CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                               progress.Dir.field_2._M_local_buf[0]) + 1);
    }
    pcVar5 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&progress,linkRuleVar._M_dataplus._M_p,
               linkRuleVar._M_dataplus._M_p + linkRuleVar._M_string_length);
    std::__cxx11::string::append((char *)&progress);
    useWatcomQuote = cmMakefile::IsOn(pcVar5,&progress.Dir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
      operator_delete(progress.Dir._M_dataplus._M_p,
                      CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                               progress.Dir.field_2._M_local_buf[0]) + 1);
    }
    cmOutputConverter::SetLinkScriptShell
              (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,bVar8);
    linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
    linkLibs._M_string_length = 0;
    linkLibs.field_2._M_local_buf[0] = '\0';
    cmMakefileTargetGenerator::CreateLinkLibs
              (&this->super_cmMakefileTargetGenerator,&linkLibs,relink,useResponseFile,&depends,
               useWatcomQuote);
    buildObjs._M_dataplus._M_p = (pointer)&buildObjs.field_2;
    buildObjs._M_string_length = 0;
    buildObjs.field_2._M_local_buf[0] = '\0';
    cmMakefileTargetGenerator::CreateObjectLists
              (&this->super_cmMakefileTargetGenerator,bVar8,false,bVar9,&buildObjs,&depends,
               useWatcomQuote);
    cmCommonTargetGenerator::GetManifests_abi_cxx11_(&manifests,(cmCommonTargetGenerator *)this);
    memset(&vars,0,0xe8);
    vars.RuleLauncher = "RULE_LAUNCH_LINK";
    vars.CMTarget =
         (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    vars.Language = linkLanguage._M_dataplus._M_p;
    vars.Objects = buildObjs._M_dataplus._M_p;
    cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&objectDir,vars.CMTarget);
    cmCommonTargetGenerator::Convert
              (&progress.Dir,(cmCommonTargetGenerator *)this,&objectDir,START_OUTPUT,SHELL);
    std::__cxx11::string::operator=((string *)&objectDir,(string *)&progress);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
      operator_delete(progress.Dir._M_dataplus._M_p,
                      CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                               progress.Dir.field_2._M_local_buf[0]) + 1);
    }
    vars.ObjectDir = objectDir._M_dataplus._M_p;
    cmCommonTargetGenerator::Convert
              (&target,(cmCommonTargetGenerator *)this,&targetFullPathReal,START_OUTPUT,
               useWatcomQuote | SHELL);
    vars.Target = target._M_dataplus._M_p;
    vars.TargetPDB = targetOutPathPDB._M_dataplus._M_p;
    targetVersionMajor._M_string_length = 0;
    targetVersionMajor.field_2._M_local_buf[0] = '\0';
    targetVersionMinor._M_string_length = 0;
    targetVersionMinor.field_2._M_local_buf[0] = '\0';
    targetVersionMinor._M_dataplus._M_p = (pointer)&targetVersionMinor.field_2;
    targetVersionMajor._M_dataplus._M_p = (pointer)&targetVersionMajor.field_2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&progress);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buildEcho);
    cmGeneratorTarget::GetTargetVersion
              ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
               ,&major,&minor);
    std::ostream::operator<<(&progress,major);
    std::ostream::operator<<(&buildEcho,minor);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&targetVersionMajor,(string *)local_3d0);
    if (local_3d0[0] != local_3c0) {
      operator_delete(local_3d0[0],local_3c0[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&targetVersionMinor,(string *)local_3d0);
    if (local_3d0[0] != local_3c0) {
      operator_delete(local_3d0[0],local_3c0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buildEcho);
    std::ios_base::~ios_base(local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progress);
    std::ios_base::~ios_base(local_790);
    vars.TargetVersionMajor = targetVersionMajor._M_dataplus._M_p;
    vars.TargetVersionMinor = targetVersionMinor._M_dataplus._M_p;
    vars.LinkLibraries = linkLibs._M_dataplus._M_p;
    vars.Flags = flags._M_dataplus._M_p;
    vars.LinkFlags = linkFlags._M_dataplus._M_p;
    vars.Manifests = manifests._M_dataplus._M_p;
    std::__cxx11::string::_M_assign
              ((string *)
               &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                super_cmLocalCommonGenerator).super_cmLocalGenerator.TargetImplib);
    if (real_link_commands.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        real_link_commands.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar17 = real_link_commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmLocalGenerator::ExpandRuleVariables
                  ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
                   pbVar17,&vars);
        pbVar17 = pbVar17 + 1;
      } while (pbVar17 !=
               real_link_commands.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    std::__cxx11::string::_M_replace
              ((ulong)&(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.TargetImplib,0,
               (char *)(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.TargetImplib.
                       _M_string_length,0x550243);
    cmOutputConverter::SetLinkScriptShell
              (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetVersionMinor._M_dataplus._M_p != &targetVersionMinor.field_2) {
      operator_delete(targetVersionMinor._M_dataplus._M_p,
                      CONCAT71(targetVersionMinor.field_2._M_allocated_capacity._1_7_,
                               targetVersionMinor.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetVersionMajor._M_dataplus._M_p != &targetVersionMajor.field_2) {
      operator_delete(targetVersionMajor._M_dataplus._M_p,
                      CONCAT71(targetVersionMajor.field_2._M_allocated_capacity._1_7_,
                               targetVersionMajor.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)target._M_dataplus._M_p != &target.field_2) {
      operator_delete(target._M_dataplus._M_p,target.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objectDir._M_dataplus._M_p != &objectDir.field_2) {
      operator_delete(objectDir._M_dataplus._M_p,objectDir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)manifests._M_dataplus._M_p != &manifests.field_2) {
      operator_delete(manifests._M_dataplus._M_p,manifests.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)buildObjs._M_dataplus._M_p != &buildObjs.field_2) {
      operator_delete(buildObjs._M_dataplus._M_p,
                      CONCAT71(buildObjs.field_2._M_allocated_capacity._1_7_,
                               buildObjs.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLibs._M_dataplus._M_p != &linkLibs.field_2) {
      operator_delete(linkLibs._M_dataplus._M_p,
                      CONCAT71(linkLibs.field_2._M_allocated_capacity._1_7_,
                               linkLibs.field_2._M_local_buf[0]) + 1);
    }
    if (bVar8 == false) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&commands1,&real_link_commands);
    }
    else {
      pcVar11 = "link.txt";
      if (relink) {
        pcVar11 = "relink.txt";
      }
      cmMakefileTargetGenerator::CreateLinkScript
                (&this->super_cmMakefileTargetGenerator,pcVar11,&real_link_commands,&commands1,
                 &depends);
    }
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    pcVar11 = cmMakefile::GetCurrentBinaryDirectory
                        ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                         Makefile);
    cmLocalUnixMakefileGenerator3::CreateCDCommand(pcVar3,&commands1,pcVar11,HOME_OUTPUT);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
               commands.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               commands1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               commands1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    pbVar7 = commands1.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar17 = commands1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (commands1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        commands1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar16 = &(commands1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar6 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (paVar16 + -1))->_M_dataplus)._M_p;
        if (paVar16 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar6) {
          operator_delete(plVar6,paVar16->_M_allocated_capacity + 1);
        }
        pbVar15 = (pointer)(paVar16 + 1);
        paVar16 = paVar16 + 2;
      } while (pbVar15 != pbVar7);
      commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar17;
    }
    if ((targetOutPath._M_string_length != targetOutPathReal._M_string_length) ||
       ((targetOutPath._M_string_length != 0 &&
        (iVar10 = bcmp(targetOutPath._M_dataplus._M_p,targetOutPathReal._M_dataplus._M_p,
                       targetOutPath._M_string_length), iVar10 != 0)))) {
      progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&progress,"$(CMAKE_COMMAND) -E cmake_symlink_executable ","");
      std::__cxx11::string::_M_append((char *)&progress,(ulong)targetOutPathReal._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&progress);
      std::__cxx11::string::_M_append((char *)&progress,(ulong)targetOutPath._M_dataplus._M_p);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&commands1,&progress.Dir);
      pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pcVar11 = cmMakefile::GetCurrentBinaryDirectory
                          ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                           Makefile);
      cmLocalUnixMakefileGenerator3::CreateCDCommand(pcVar3,&commands1,pcVar11,HOME_OUTPUT);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 commands1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 commands1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      pbVar7 = commands1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar17 = commands1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (commands1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          commands1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar16 = &(commands1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar6 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (paVar16 + -1))->_M_dataplus)._M_p;
          if (paVar16 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar6) {
            operator_delete(plVar6,paVar16->_M_allocated_capacity + 1);
          }
          pbVar15 = (pointer)(paVar16 + 1);
          paVar16 = paVar16 + 2;
        } while (pbVar15 != pbVar7);
        commands1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar17;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
        operator_delete(progress.Dir._M_dataplus._M_p,
                        CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                                 progress.Dir.field_2._M_local_buf[0]) + 1);
      }
    }
    if (!relink) {
      pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pvVar13 = cmGeneratorTarget::GetPostBuildCommands
                          ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                           GeneratorTarget);
      cmLocalUnixMakefileGenerator3::AppendCustomCommands
                (pcVar3,&commands,pvVar13,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget,HOME_OUTPUT);
    }
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              ((this->super_cmMakefileTargetGenerator).LocalGenerator,
               (ostream *)(this->super_cmMakefileTargetGenerator).BuildFileStream,(char *)0x0,
               &targetFullPathReal,&depends,&commands,false,false);
    if ((targetFullPath._M_string_length != targetFullPathReal._M_string_length) ||
       ((targetFullPath._M_string_length != 0 &&
        (iVar10 = bcmp(targetFullPath._M_dataplus._M_p,targetFullPathReal._M_dataplus._M_p,
                       targetFullPath._M_string_length), iVar10 != 0)))) {
      pbVar7 = depends.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar17 = depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar16 = &(depends.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar6 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (paVar16 + -1))->_M_dataplus)._M_p;
          if (paVar16 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar6) {
            operator_delete(plVar6,paVar16->_M_allocated_capacity + 1);
          }
          pbVar15 = (pointer)(paVar16 + 1);
          paVar16 = paVar16 + 2;
        } while (pbVar15 != pbVar7);
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar17;
      }
      pbVar7 = commands.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar17 = commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (commands.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          commands.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar16 = &(commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar6 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (paVar16 + -1))->_M_dataplus)._M_p;
          if (paVar16 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar6) {
            operator_delete(plVar6,paVar16->_M_allocated_capacity + 1);
          }
          pbVar15 = (pointer)(paVar16 + 1);
          paVar16 = paVar16 + 2;
        } while (pbVar15 != pbVar7);
        commands.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar17;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&depends,&targetFullPathReal);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                ((this->super_cmMakefileTargetGenerator).LocalGenerator,
                 (ostream *)(this->super_cmMakefileTargetGenerator).BuildFileStream,(char *)0x0,
                 &targetFullPath,&depends,&commands,false,false);
    }
    cmMakefileTargetGenerator::WriteTargetDriverRule
              (&this->super_cmMakefileTargetGenerator,&targetFullPath,relink);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (this->super_cmMakefileTargetGenerator).CleanFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               exeCleanFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               exeCleanFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commands1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkRule._M_dataplus._M_p != &linkRule.field_2) {
      operator_delete(linkRule._M_dataplus._M_p,linkRule.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkRuleVar._M_dataplus._M_p != &linkRuleVar.field_2) {
      operator_delete(linkRuleVar._M_dataplus._M_p,linkRuleVar.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&real_link_commands);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&exeCleanFiles);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkFlagsConfig._M_dataplus._M_p != &linkFlagsConfig.field_2) {
      operator_delete(linkFlagsConfig._M_dataplus._M_p,
                      linkFlagsConfig.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
      operator_delete(linkFlags._M_dataplus._M_p,
                      CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                               linkFlags.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)flags._M_dataplus._M_p != &flags.field_2) {
      operator_delete(flags._M_dataplus._M_p,
                      CONCAT71(flags.field_2._M_allocated_capacity._1_7_,
                               flags.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkLanguage._M_dataplus._M_p != &linkLanguage.field_2) {
    operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutPathImport._M_dataplus._M_p != &targetOutPathImport.field_2) {
    operator_delete(targetOutPathImport._M_dataplus._M_p,
                    targetOutPathImport.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutPathReal._M_dataplus._M_p != &targetOutPathReal.field_2) {
    operator_delete(targetOutPathReal._M_dataplus._M_p,
                    targetOutPathReal.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutPath._M_dataplus._M_p != &targetOutPath.field_2) {
    operator_delete(targetOutPath._M_dataplus._M_p,targetOutPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutPathPDB._M_dataplus._M_p != &targetOutPathPDB.field_2) {
    operator_delete(targetOutPathPDB._M_dataplus._M_p,
                    targetOutPathPDB.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetFullPathImport._M_dataplus._M_p != &targetFullPathImport.field_2) {
    operator_delete(targetFullPathImport._M_dataplus._M_p,
                    targetFullPathImport.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetFullPathPDB._M_dataplus._M_p != &targetFullPathPDB.field_2) {
    operator_delete(targetFullPathPDB._M_dataplus._M_p,
                    targetFullPathPDB.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetFullPathReal._M_dataplus._M_p != &targetFullPathReal.field_2) {
    operator_delete(targetFullPathReal._M_dataplus._M_p,
                    targetFullPathReal.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetFullPath._M_dataplus._M_p != &targetFullPath.field_2) {
    operator_delete(targetFullPath._M_dataplus._M_p,targetFullPath.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pdbOutputPath._M_dataplus._M_p != &pdbOutputPath.field_2) {
    operator_delete(pdbOutputPath._M_dataplus._M_p,pdbOutputPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compilePdbOutputPath._M_dataplus._M_p != &compilePdbOutputPath.field_2) {
    operator_delete(compilePdbOutputPath._M_dataplus._M_p,
                    compilePdbOutputPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outpathImp._M_dataplus._M_p != &outpathImp.field_2) {
    operator_delete(outpathImp._M_dataplus._M_p,
                    CONCAT71(outpathImp.field_2._M_allocated_capacity._1_7_,
                             outpathImp.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outpath._M_dataplus._M_p != &outpath.field_2) {
    operator_delete(outpath._M_dataplus._M_p,outpath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNamePDB._M_dataplus._M_p != &targetNamePDB.field_2) {
    operator_delete(targetNamePDB._M_dataplus._M_p,
                    CONCAT71(targetNamePDB.field_2._M_allocated_capacity._1_7_,
                             targetNamePDB.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNameImport._M_dataplus._M_p != &targetNameImport.field_2) {
    operator_delete(targetNameImport._M_dataplus._M_p,
                    CONCAT71(targetNameImport.field_2._M_allocated_capacity._1_7_,
                             targetNameImport.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNameReal._M_dataplus._M_p != &targetNameReal.field_2) {
    operator_delete(targetNameReal._M_dataplus._M_p,
                    CONCAT71(targetNameReal.field_2._M_allocated_capacity._1_7_,
                             targetNameReal.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetName._M_dataplus._M_p != &targetName.field_2) {
    operator_delete(targetName._M_dataplus._M_p,
                    CONCAT71(targetName.field_2._M_allocated_capacity._1_7_,
                             targetName.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  return;
}

Assistant:

void cmMakefileExecutableTargetGenerator::WriteExecutableRule(bool relink)
{
  std::vector<std::string> commands;

  // Build list of dependencies.
  std::vector<std::string> depends;
  this->AppendLinkDepends(depends);

  // Get the name of the executable to generate.
  std::string targetName;
  std::string targetNameReal;
  std::string targetNameImport;
  std::string targetNamePDB;
  this->GeneratorTarget->GetExecutableNames
    (targetName, targetNameReal, targetNameImport, targetNamePDB,
     this->ConfigName);

  // Construct the full path version of the names.
  std::string outpath = this->GeneratorTarget->GetDirectory(this->ConfigName);
  if(this->GeneratorTarget->IsAppBundleOnApple())
    {
    this->OSXBundleGenerator->CreateAppBundle(targetName, outpath);
    }
  outpath += "/";
  std::string outpathImp;
  if(relink)
    {
    outpath = this->Makefile->GetCurrentBinaryDirectory();
    outpath += cmake::GetCMakeFilesDirectory();
    outpath += "/CMakeRelink.dir";
    cmSystemTools::MakeDirectory(outpath.c_str());
    outpath += "/";
    if(!targetNameImport.empty())
      {
      outpathImp = outpath;
      }
    }
  else
    {
    cmSystemTools::MakeDirectory(outpath.c_str());
    if(!targetNameImport.empty())
      {
      outpathImp = this->GeneratorTarget->GetDirectory(this->ConfigName, true);
      cmSystemTools::MakeDirectory(outpathImp.c_str());
      outpathImp += "/";
      }
    }

  std::string compilePdbOutputPath =
    this->GeneratorTarget->GetCompilePDBDirectory(this->ConfigName);
  cmSystemTools::MakeDirectory(compilePdbOutputPath.c_str());

  std::string pdbOutputPath =
      this->GeneratorTarget->GetPDBDirectory(this->ConfigName);
  cmSystemTools::MakeDirectory(pdbOutputPath.c_str());
  pdbOutputPath += "/";

  std::string targetFullPath = outpath + targetName;
  std::string targetFullPathReal = outpath + targetNameReal;
  std::string targetFullPathPDB =  pdbOutputPath + targetNamePDB;
  std::string targetFullPathImport = outpathImp + targetNameImport;
  std::string targetOutPathPDB =
    this->Convert(targetFullPathPDB,
                  cmLocalGenerator::NONE,
                  cmLocalGenerator::SHELL);
  // Convert to the output path to use in constructing commands.
  std::string targetOutPath =
    this->Convert(targetFullPath,
                  cmLocalGenerator::START_OUTPUT,
                  cmLocalGenerator::SHELL);
  std::string targetOutPathReal =
    this->Convert(targetFullPathReal,
                  cmLocalGenerator::START_OUTPUT,
                  cmLocalGenerator::SHELL);
  std::string targetOutPathImport =
    this->Convert(targetFullPathImport,
                  cmLocalGenerator::START_OUTPUT,
                  cmLocalGenerator::SHELL);

  // Get the language to use for linking this executable.
  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);

  // Make sure we have a link language.
  if(linkLanguage.empty())
    {
    cmSystemTools::Error("Cannot determine link language for target \"",
                         this->GeneratorTarget->GetName().c_str(), "\".");
    return;
    }

  this->NumberOfProgressActions++;
  if(!this->NoRuleMessages)
    {
    cmLocalUnixMakefileGenerator3::EchoProgress progress;
    this->MakeEchoProgress(progress);
    // Add the link message.
    std::string buildEcho = "Linking ";
    buildEcho += linkLanguage;
    buildEcho += " executable ";
    buildEcho += targetOutPath;
    this->LocalGenerator->AppendEcho(commands, buildEcho.c_str(),
                                     cmLocalUnixMakefileGenerator3::EchoLink,
                                     &progress);
    }

  // Build a list of compiler flags and linker flags.
  std::string flags;
  std::string linkFlags;

  // Add flags to create an executable.
  this->LocalGenerator->
    AddConfigVariableFlags(linkFlags, "CMAKE_EXE_LINKER_FLAGS",
                           this->ConfigName);


  if(this->GeneratorTarget->GetPropertyAsBool("WIN32_EXECUTABLE"))
    {
    this->LocalGenerator->AppendFlags
      (linkFlags, this->Makefile->GetDefinition("CMAKE_CREATE_WIN32_EXE"));
    }
  else
    {
    this->LocalGenerator->AppendFlags
      (linkFlags, this->Makefile->GetDefinition("CMAKE_CREATE_CONSOLE_EXE"));
    }

  // Add symbol export flags if necessary.
  if(this->GeneratorTarget->IsExecutableWithExports())
    {
    std::string export_flag_var = "CMAKE_EXE_EXPORTS_";
    export_flag_var += linkLanguage;
    export_flag_var += "_FLAG";
    this->LocalGenerator->AppendFlags
      (linkFlags, this->Makefile->GetDefinition(export_flag_var));
    }

  // Add language feature flags.
  this->AddFeatureFlags(flags, linkLanguage);

  this->LocalGenerator->AddArchitectureFlags(flags, this->GeneratorTarget,
                                             linkLanguage, this->ConfigName);

  // Add target-specific linker flags.
  this->LocalGenerator->AppendFlags
    (linkFlags, this->GeneratorTarget->GetProperty("LINK_FLAGS"));
  std::string linkFlagsConfig = "LINK_FLAGS_";
  linkFlagsConfig += cmSystemTools::UpperCase(this->ConfigName);
  this->LocalGenerator->AppendFlags
    (linkFlags, this->GeneratorTarget->GetProperty(linkFlagsConfig));

  this->AddModuleDefinitionFlag(linkFlags);

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> exeCleanFiles;
  exeCleanFiles.push_back(this->Convert(targetFullPath,
                                        cmLocalGenerator::START_OUTPUT,
                                        cmLocalGenerator::UNCHANGED));
#ifdef _WIN32
  // There may be a manifest file for this target.  Add it to the
  // clean set just in case.
  exeCleanFiles.push_back(this->Convert((targetFullPath+".manifest").c_str(),
                                        cmLocalGenerator::START_OUTPUT,
                                        cmLocalGenerator::UNCHANGED));
#endif
  if(targetNameReal != targetName)
    {
    exeCleanFiles.push_back(this->Convert(targetFullPathReal,
                                          cmLocalGenerator::START_OUTPUT,
                                          cmLocalGenerator::UNCHANGED));
    }
  if(!targetNameImport.empty())
    {
    exeCleanFiles.push_back(this->Convert(targetFullPathImport,
                                          cmLocalGenerator::START_OUTPUT,
                                          cmLocalGenerator::UNCHANGED));
    std::string implib;
    if(this->GeneratorTarget->GetImplibGNUtoMS(targetFullPathImport, implib))
      {
      exeCleanFiles.push_back(this->Convert(implib,
                                            cmLocalGenerator::START_OUTPUT,
                                            cmLocalGenerator::UNCHANGED));
      }
    }

  // List the PDB for cleaning only when the whole target is
  // cleaned.  We do not want to delete the .pdb file just before
  // linking the target.
  this->CleanFiles.push_back
    (this->Convert(targetFullPathPDB,
                   cmLocalGenerator::START_OUTPUT,
                   cmLocalGenerator::UNCHANGED));

  // Add the pre-build and pre-link rules building but not when relinking.
  if(!relink)
    {
    this->LocalGenerator
      ->AppendCustomCommands(commands,
                        this->GeneratorTarget->GetPreBuildCommands(),
                        this->GeneratorTarget);
    this->LocalGenerator
      ->AppendCustomCommands(commands,
                        this->GeneratorTarget->GetPreLinkCommands(),
                        this->GeneratorTarget);
    }

  // Determine whether a link script will be used.
  bool useLinkScript = this->GlobalGenerator->GetUseLinkScript();

  // Construct the main link rule.
  std::vector<std::string> real_link_commands;
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_LINK_EXECUTABLE";
  std::string linkRule = this->GetLinkRule(linkRuleVar);
  std::vector<std::string> commands1;
  cmSystemTools::ExpandListArgument(linkRule, real_link_commands);
  if(this->GeneratorTarget->IsExecutableWithExports())
    {
    // If a separate rule for creating an import library is specified
    // add it now.
    std::string implibRuleVar = "CMAKE_";
    implibRuleVar += linkLanguage;
    implibRuleVar += "_CREATE_IMPORT_LIBRARY";
    if(const char* rule =
       this->Makefile->GetDefinition(implibRuleVar))
      {
      cmSystemTools::ExpandListArgument(rule, real_link_commands);
      }
    }

  // Select whether to use a response file for objects.
  bool useResponseFileForObjects = false;
  {
  std::string responseVar = "CMAKE_";
  responseVar += linkLanguage;
  responseVar += "_USE_RESPONSE_FILE_FOR_OBJECTS";
  if(this->Makefile->IsOn(responseVar))
    {
    useResponseFileForObjects = true;
    }
  }

  // Select whether to use a response file for libraries.
  bool useResponseFileForLibs = false;
  {
  std::string responseVar = "CMAKE_";
  responseVar += linkLanguage;
  responseVar += "_USE_RESPONSE_FILE_FOR_LIBRARIES";
  if(this->Makefile->IsOn(responseVar))
    {
    useResponseFileForLibs = true;
    }
  }

  // Expand the rule variables.
  {
  bool useWatcomQuote = this->Makefile->IsOn(linkRuleVar+"_USE_WATCOM_QUOTE");

  // Set path conversion for link script shells.
  this->LocalGenerator->SetLinkScriptShell(useLinkScript);

  // Collect up flags to link in needed libraries.
  std::string linkLibs;
  this->CreateLinkLibs(linkLibs, relink, useResponseFileForLibs, depends,
                       useWatcomQuote);

  // Construct object file lists that may be needed to expand the
  // rule.
  std::string buildObjs;
  this->CreateObjectLists(useLinkScript, false,
                          useResponseFileForObjects, buildObjs, depends,
                          useWatcomQuote);

  std::string manifests = this->GetManifests();

  cmLocalGenerator::RuleVariables vars;
  vars.RuleLauncher = "RULE_LAUNCH_LINK";
  vars.CMTarget = this->GeneratorTarget;
  vars.Language = linkLanguage.c_str();
  vars.Objects = buildObjs.c_str();
  std::string objectDir = this->GeneratorTarget->GetSupportDirectory();
  objectDir = this->Convert(objectDir,
                            cmLocalGenerator::START_OUTPUT,
                            cmLocalGenerator::SHELL);
  vars.ObjectDir = objectDir.c_str();
  cmLocalGenerator::OutputFormat output = (useWatcomQuote) ?
    cmLocalGenerator::WATCOMQUOTE : cmLocalGenerator::SHELL;
  std::string target = this->Convert(targetFullPathReal,
                                     cmLocalGenerator::START_OUTPUT,
                                     output);
  vars.Target = target.c_str();
  vars.TargetPDB = targetOutPathPDB.c_str();

  // Setup the target version.
  std::string targetVersionMajor;
  std::string targetVersionMinor;
  {
  std::ostringstream majorStream;
  std::ostringstream minorStream;
  int major;
  int minor;
  this->GeneratorTarget->GetTargetVersion(major, minor);
  majorStream << major;
  minorStream << minor;
  targetVersionMajor = majorStream.str();
  targetVersionMinor = minorStream.str();
  }
  vars.TargetVersionMajor = targetVersionMajor.c_str();
  vars.TargetVersionMinor = targetVersionMinor.c_str();

  vars.LinkLibraries = linkLibs.c_str();
  vars.Flags = flags.c_str();
  vars.LinkFlags = linkFlags.c_str();
  vars.Manifests = manifests.c_str();

  // Expand placeholders in the commands.
  this->LocalGenerator->TargetImplib = targetOutPathImport;
  for(std::vector<std::string>::iterator i = real_link_commands.begin();
      i != real_link_commands.end(); ++i)
    {
    this->LocalGenerator->ExpandRuleVariables(*i, vars);
    }
  this->LocalGenerator->TargetImplib = "";

  // Restore path conversion to normal shells.
  this->LocalGenerator->SetLinkScriptShell(false);
  }

  // Optionally convert the build rule to use a script to avoid long
  // command lines in the make shell.
  if(useLinkScript)
    {
    // Use a link script.
    const char* name = (relink? "relink.txt" : "link.txt");
    this->CreateLinkScript(name, real_link_commands, commands1, depends);
    }
  else
    {
    // No link script.  Just use the link rule directly.
    commands1 = real_link_commands;
    }
  this->LocalGenerator->CreateCDCommand
    (commands1,
     this->Makefile->GetCurrentBinaryDirectory(),
     cmLocalGenerator::HOME_OUTPUT);
  commands.insert(commands.end(), commands1.begin(), commands1.end());
  commands1.clear();

  // Add a rule to create necessary symlinks for the library.
  if(targetOutPath != targetOutPathReal)
    {
    std::string symlink = "$(CMAKE_COMMAND) -E cmake_symlink_executable ";
    symlink += targetOutPathReal;
    symlink += " ";
    symlink += targetOutPath;
    commands1.push_back(symlink);
    this->LocalGenerator->CreateCDCommand(commands1,
                                  this->Makefile->GetCurrentBinaryDirectory(),
                                  cmLocalGenerator::HOME_OUTPUT);
    commands.insert(commands.end(), commands1.begin(), commands1.end());
    commands1.clear();
    }

  // Add the post-build rules when building but not when relinking.
  if(!relink)
    {
    this->LocalGenerator->
      AppendCustomCommands(commands,
                       this->GeneratorTarget->GetPostBuildCommands(),
                       this->GeneratorTarget);
    }

  // Write the build rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream,
                                      0,
                                      targetFullPathReal,
                                      depends, commands, false);

  // The symlink name for the target should depend on the real target
  // so if the target version changes it rebuilds and recreates the
  // symlink.
  if(targetFullPath != targetFullPathReal)
    {
    depends.clear();
    commands.clear();
    depends.push_back(targetFullPathReal);
    this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, 0,
                                        targetFullPath,
                                        depends, commands, false);
    }

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(targetFullPath, relink);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(this->CleanFiles.end(),
                          exeCleanFiles.begin(),
                          exeCleanFiles.end());
}